

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O1

void __thiscall crnlib::qdxt5::qdxt5(qdxt5 *this,task_pool *task_pool)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->m_pTask_pool = task_pool;
  this->m_main_thread_id = 0;
  this->m_canceled = false;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  *(undefined8 *)&this->m_num_blocks = 0;
  *(undefined8 *)((long)&this->m_pBlocks + 4) = 0;
  *(undefined8 *)((long)&this->m_pDst_elements + 4) = 0;
  (this->m_params).m_quality_level = 0xff;
  (this->m_params).m_dxt_quality = cCRNDXTQualityUber;
  (this->m_params).m_num_mips = 0;
  (this->m_params).m_pProgress_func = (progress_callback_func)0x0;
  (this->m_params).m_pProgress_data = (void *)0x0;
  (this->m_params).m_hierarchical = true;
  memset((this->m_params).m_mip_desc,0,0x600);
  (this->m_params).m_comp_index = 3;
  (this->m_params).m_progress_start = 0;
  (this->m_params).m_progress_range = 100;
  (this->m_params).m_use_both_block_types = true;
  this->m_max_selector_clusters = 0;
  this->m_prev_percentage_complete = -1;
  (this->m_endpoint_clusterizer).m_training_vecs.m_p =
       (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
  (this->m_endpoint_clusterizer).m_training_vecs.m_size = 0;
  (this->m_endpoint_clusterizer).m_training_vecs.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_nodes.m_p = (vq_node *)0x0;
  (this->m_endpoint_clusterizer).m_nodes.m_size = 0;
  (this->m_endpoint_clusterizer).m_nodes.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_codebook.m_p = (vec<2U,_float> *)0x0;
  (this->m_endpoint_clusterizer).m_codebook.m_size = 0;
  (this->m_endpoint_clusterizer).m_codebook.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_overall_variance = 0.0;
  (this->m_endpoint_clusterizer).m_split_index = 0;
  (this->m_endpoint_clusterizer).m_heap.m_p = (uint *)0x0;
  *(undefined8 *)((long)&(this->m_endpoint_clusterizer).m_heap.m_p + 5) = 0;
  *(undefined8 *)((long)&(this->m_endpoint_clusterizer).m_heap.m_capacity + 1) = 0;
  (this->m_endpoint_clusterizer).m_left_children.m_p = (uint *)0x0;
  (this->m_endpoint_clusterizer).m_left_children.m_size = 0;
  (this->m_endpoint_clusterizer).m_left_children.m_capacity = 0;
  (this->m_endpoint_clusterizer).m_right_children.m_p = (uint *)0x0;
  (this->m_endpoint_clusterizer).m_right_children.m_size = 0;
  (this->m_endpoint_clusterizer).m_right_children.m_capacity = 0;
  (this->m_endpoint_cluster_indices).m_p = (vector<unsigned_int> *)0x0;
  (this->m_endpoint_cluster_indices).m_size = 0;
  (this->m_endpoint_cluster_indices).m_capacity = 0;
  (this->m_selector_clusterizer).m_pTask_pool = task_pool;
  lVar2 = 0x700;
  do {
    puVar1 = (undefined8 *)((long)(this->m_params).m_mip_desc + lVar2 + -0xb);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)((this->m_params).m_mip_desc + -2) + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m_params).m_mip_desc + lVar2 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m_params).m_mip_desc + lVar2 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)((this->m_params).m_mip_desc + -6) + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(this->m_params).m_mip_desc[0].m_block_height + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(this->m_params).m_mip_desc[2].m_first_block + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x8c0);
  (this->m_selector_clusterizer).m_pProgress_callback = (progress_callback_func)0x0;
  (this->m_selector_clusterizer).m_pProgress_callback_data = (void *)0x0;
  (this->m_selector_clusterizer).m_canceled = false;
  memset(this->m_cached_selector_cluster_indices,0,0x1000);
  (this->m_cluster_hash).m_values.m_p = (raw_node *)0x0;
  (this->m_cluster_hash).m_values.m_size = 0;
  (this->m_cluster_hash).m_values.m_capacity = 0;
  (this->m_cluster_hash).m_hash_shift = 0x20;
  (this->m_cluster_hash).m_num_valid = 0;
  (this->m_cluster_hash).m_grow_threshold = 0;
  spinlock::spinlock(&this->m_cluster_hash_lock);
  return;
}

Assistant:

qdxt5::qdxt5(task_pool& task_pool)
    : m_pTask_pool(&task_pool),
      m_main_thread_id(0),
      m_canceled(false),
      m_progress_start(0),
      m_progress_range(100),
      m_num_blocks(0),
      m_pBlocks(NULL),
      m_pDst_elements(NULL),
      m_elements_per_block(0),
      m_max_selector_clusters(0),
      m_prev_percentage_complete(-1),
      m_selector_clusterizer(task_pool) {
}